

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O2

void __thiscall TPZVec<TPZGeoNode_*>::TPZVec(TPZVec<TPZGeoNode_*> *this,TPZVec<TPZGeoNode_*> *rval)

{
  long lVar1;
  TPZGeoNode **ppTVar2;
  ulong uVar3;
  ulong uVar4;
  
  this->_vptr_TPZVec = (_func_int **)&PTR__TPZVec_01649428;
  uVar4 = rval->fNElements;
  this->fNElements = uVar4;
  lVar1 = rval->fNAlloc;
  if (lVar1 == 0) {
    uVar3 = 0;
    ppTVar2 = (TPZGeoNode **)operator_new__(-(ulong)(uVar4 >> 0x3d != 0) | uVar4 * 8);
    this->fStore = ppTVar2;
    if ((long)uVar4 < 1) {
      uVar4 = uVar3;
    }
    for (; uVar4 != uVar3; uVar3 = uVar3 + 1) {
      this->fStore[uVar3] = rval->fStore[uVar3];
    }
  }
  else {
    this->fStore = rval->fStore;
    this->fNAlloc = lVar1;
    rval->fStore = (TPZGeoNode **)0x0;
    rval->fNAlloc = 0;
  }
  return;
}

Assistant:

TPZVec<T>::TPZVec(TPZVec<T> &&rval) : fNElements(rval.fNElements){
    if(rval.fNAlloc){
        fStore = rval.fStore;
        fNAlloc = rval.fNAlloc;
        rval.fStore = nullptr;
        rval.fNAlloc = 0;
    }else{//rval did not allocate memory. let us just copy
        fStore = new T[fNElements];
        for(int64_t i=0; i<fNElements; i++)
            fStore[i]=rval.fStore[i];
    }
    
}